

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_vfs_or_default_tell(ma_vfs *pVFS,ma_vfs_file file,ma_int64 *pCursor)

{
  ma_vfs_file in_RDX;
  ma_vfs *in_RSI;
  long in_RDI;
  ma_int64 *in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  if (in_RDI == 0) {
    local_4 = ma_default_vfs_tell(in_RSI,in_RDX,in_stack_ffffffffffffffd8);
  }
  else {
    local_4 = ma_vfs_tell(in_RSI,in_RDX,in_stack_ffffffffffffffd8);
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_vfs_or_default_tell(ma_vfs* pVFS, ma_vfs_file file, ma_int64* pCursor)
{
    if (pVFS != NULL) {
        return ma_vfs_tell(pVFS, file, pCursor);
    } else {
        return ma_default_vfs_tell(pVFS, file, pCursor);
    }
}